

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O2

int __thiscall pzshape::TPZShapePiramHdiv::ClassId(TPZShapePiramHdiv *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZShapePiramHdiv",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZShapePiram::ClassId(&this->super_TPZShapePiram);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZShapePiramHdiv::ClassId() const{
        return Hash("TPZShapePiramHdiv") ^ TPZShapePiram::ClassId() << 1;
    }